

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
embree::MetalMaterial::MetalMaterial
          (MetalMaterial *this,Vec3fa *reflectance,Vec3fa *eta,Vec3fa *k,float roughness)

{
  size_type sVar1;
  undefined8 uVar2;
  size_type *in_RCX;
  undefined8 *in_RDX;
  size_type *in_RSI;
  MaterialNode *in_RDI;
  undefined4 in_XMM0_Da;
  string *in_stack_ffffffffffffff58;
  allocator local_79;
  string local_78 [36];
  undefined4 local_54;
  size_type *local_50;
  undefined8 *local_48;
  size_type *local_40;
  
  local_54 = in_XMM0_Da;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  SceneGraph::MaterialNode::MaterialNode(in_RDI,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__MetalMaterial_00647c90;
  Material::Material((Material *)&in_RDI[1].super_Node.super_RefCount.refCounter,MATERIAL_METAL);
  sVar1 = local_40[1];
  in_RDI[1].super_Node.fileName._M_string_length = *local_40;
  in_RDI[1].super_Node.fileName.field_2._M_allocated_capacity = sVar1;
  uVar2 = local_48[1];
  *(undefined8 *)((long)&in_RDI[1].super_Node.fileName.field_2 + 8) = *local_48;
  *(undefined8 *)&in_RDI[1].super_Node.name = uVar2;
  sVar1 = local_50[1];
  in_RDI[1].super_Node.name._M_string_length = *local_50;
  in_RDI[1].super_Node.name.field_2._M_allocated_capacity = sVar1;
  *(undefined4 *)((long)&in_RDI[1].super_Node.name.field_2 + 8) = local_54;
  return;
}

Assistant:

MetalMaterial (const Vec3fa& reflectance, const Vec3fa& eta, const Vec3fa& k, const float roughness)
      : base(MATERIAL_METAL), reflectance(reflectance), eta(eta), k(k), roughness(roughness) {}